

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_morton.h
# Opt level: O2

void __thiscall
embree::avx::BVHBuilderMorton::
BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<8>_>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<8>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<8>,_8>::Create,_embree::avx::SetBVHNBounds<8>,_embree::avx::CreateMortonLeaf<8,_embree::TriangleMi<4>_>,_embree::avx::CalculateMeshBounds<embree::TriangleMesh>,_embree::Scene::BuildProgressMonitorInterface>
::recreateMortonCodes
          (BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<8>_>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<8>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<8>,_8>::Create,_embree::avx::SetBVHNBounds<8>,_embree::avx::CreateMortonLeaf<8,_embree::TriangleMi<4>_>,_embree::avx::CalculateMeshBounds<embree::TriangleMesh>,_embree::Scene::BuildProgressMonitorInterface>
           *this,range<unsigned_int> *current)

{
  uint uVar1;
  TriangleMesh *pTVar2;
  long lVar3;
  char *pcVar4;
  size_t sVar5;
  undefined1 auVar6 [16];
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  char cVar11;
  runtime_error *prVar12;
  uint uVar13;
  size_t i;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  size_t i_1;
  ulong uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  vfloat4 lower;
  anon_class_8_1_8991fb9c calculateCentBounds;
  anon_class_8_1_898bcfc2 local_110;
  blocked_range<unsigned_int> local_108;
  MortonCodeMapping mapping;
  BBox3fa centBounds;
  task_group_context context;
  
  uVar13 = current->_begin;
  uVar17 = (ulong)uVar13;
  uVar1 = current->_end;
  uVar15 = (ulong)uVar1;
  if (uVar1 - uVar13 < 0x400) {
    auVar20._8_4_ = 0xff800000;
    auVar20._0_8_ = 0xff800000ff800000;
    auVar20._12_4_ = 0xff800000;
    auVar18._8_4_ = 0x7f800000;
    auVar18._0_8_ = 0x7f8000007f800000;
    auVar18._12_4_ = 0x7f800000;
    for (uVar14 = uVar17; uVar14 < uVar15; uVar14 = uVar14 + 1) {
      pTVar2 = this->calculateBounds->mesh;
      lVar16 = (ulong)this->morton[uVar14].field_0.field_0.index * *(long *)&pTVar2->field_0x68;
      lVar3 = *(long *)&(pTVar2->super_Geometry).field_0x58;
      pcVar4 = (pTVar2->vertices0).super_RawBufferView.ptr_ofs;
      sVar5 = (pTVar2->vertices0).super_RawBufferView.stride;
      auVar6 = vminps_avx(*(undefined1 (*) [16])(pcVar4 + *(uint *)(lVar3 + lVar16) * sVar5),
                          *(undefined1 (*) [16])(pcVar4 + *(uint *)(lVar3 + 4 + lVar16) * sVar5));
      auVar23 = vminps_avx(auVar6,*(undefined1 (*) [16])
                                   (pcVar4 + *(uint *)(lVar3 + 8 + lVar16) * sVar5));
      auVar6 = vmaxps_avx(*(undefined1 (*) [16])(pcVar4 + *(uint *)(lVar3 + lVar16) * sVar5),
                          *(undefined1 (*) [16])(pcVar4 + *(uint *)(lVar3 + 4 + lVar16) * sVar5));
      auVar6 = vmaxps_avx(auVar6,*(undefined1 (*) [16])
                                  (pcVar4 + *(uint *)(lVar3 + 8 + lVar16) * sVar5));
      auVar24._0_4_ = auVar23._0_4_ + auVar6._0_4_;
      auVar24._4_4_ = auVar23._4_4_ + auVar6._4_4_;
      auVar24._8_4_ = auVar23._8_4_ + auVar6._8_4_;
      auVar24._12_4_ = auVar23._12_4_ + auVar6._12_4_;
      auVar18 = vminps_avx(auVar18,auVar24);
      auVar20 = vmaxps_avx(auVar20,auVar24);
    }
    auVar19 = vsubps_avx(auVar20,auVar18);
    auVar25._8_4_ = 0x1fec1e4a;
    auVar25._0_8_ = 0x1fec1e4a1fec1e4a;
    auVar25._12_4_ = 0x1fec1e4a;
    auVar6 = vcmpps_avx(auVar19,auVar25,6);
    auVar23 = vrcpps_avx(auVar19);
    fVar7 = auVar23._0_4_;
    auVar21._0_4_ = auVar19._0_4_ * fVar7;
    fVar8 = auVar23._4_4_;
    auVar21._4_4_ = auVar19._4_4_ * fVar8;
    fVar9 = auVar23._8_4_;
    auVar21._8_4_ = auVar19._8_4_ * fVar9;
    fVar10 = auVar23._12_4_;
    auVar21._12_4_ = auVar19._12_4_ * fVar10;
    auVar29._8_4_ = 0x3f800000;
    auVar29._0_8_ = 0x3f8000003f800000;
    auVar29._12_4_ = 0x3f800000;
    auVar23 = vsubps_avx(auVar29,auVar21);
    auVar22._0_4_ = (fVar7 + fVar7 * auVar23._0_4_) * 1013.76;
    auVar22._4_4_ = (fVar8 + fVar8 * auVar23._4_4_) * 1013.76;
    auVar22._8_4_ = (fVar9 + fVar9 * auVar23._8_4_) * 1013.76;
    auVar22._12_4_ = (fVar10 + fVar10 * auVar23._12_4_) * 1013.76;
    auVar6 = vandps_avx(auVar6,auVar22);
    auVar26._8_4_ = 0x30000ff;
    auVar26._0_8_ = 0x30000ff030000ff;
    auVar26._12_4_ = 0x30000ff;
    auVar27._8_4_ = 0x101;
    auVar27._0_8_ = 0x10100000101;
    auVar27._12_4_ = 0x101;
    auVar30._8_4_ = 0x300f00f;
    auVar30._0_8_ = 0x300f00f0300f00f;
    auVar30._12_4_ = 0x300f00f;
    auVar31._8_4_ = 0x11;
    auVar31._0_8_ = 0x1100000011;
    auVar31._12_4_ = 0x11;
    auVar32._8_4_ = 0x30c30c3;
    auVar32._0_8_ = 0x30c30c3030c30c3;
    auVar32._12_4_ = 0x30c30c3;
    auVar23 = vpmovsxbd_avx(ZEXT416(0x1405));
    for (; uVar17 < uVar15; uVar17 = uVar17 + 1) {
      pTVar2 = this->calculateBounds->mesh;
      lVar16 = (ulong)this->morton[uVar17].field_0.field_0.index * *(long *)&pTVar2->field_0x68;
      lVar3 = *(long *)&(pTVar2->super_Geometry).field_0x58;
      pcVar4 = (pTVar2->vertices0).super_RawBufferView.ptr_ofs;
      sVar5 = (pTVar2->vertices0).super_RawBufferView.stride;
      auVar19 = vminps_avx(*(undefined1 (*) [16])(pcVar4 + *(uint *)(lVar3 + lVar16) * sVar5),
                           *(undefined1 (*) [16])(pcVar4 + *(uint *)(lVar3 + 4 + lVar16) * sVar5));
      auVar35 = vminps_avx(auVar19,*(undefined1 (*) [16])
                                    (pcVar4 + *(uint *)(lVar3 + 8 + lVar16) * sVar5));
      auVar19 = vmaxps_avx(*(undefined1 (*) [16])(pcVar4 + *(uint *)(lVar3 + lVar16) * sVar5),
                           *(undefined1 (*) [16])(pcVar4 + *(uint *)(lVar3 + 4 + lVar16) * sVar5));
      auVar19 = vmaxps_avx(auVar19,*(undefined1 (*) [16])
                                    (pcVar4 + *(uint *)(lVar3 + 8 + lVar16) * sVar5));
      auVar33._0_4_ = auVar35._0_4_ + auVar19._0_4_;
      auVar33._4_4_ = auVar35._4_4_ + auVar19._4_4_;
      auVar33._8_4_ = auVar35._8_4_ + auVar19._8_4_;
      auVar33._12_4_ = auVar35._12_4_ + auVar19._12_4_;
      auVar19 = vsubps_avx(auVar33,auVar18);
      auVar34._0_4_ = auVar19._0_4_ * auVar6._0_4_;
      auVar34._4_4_ = auVar19._4_4_ * auVar6._4_4_;
      auVar34._8_4_ = auVar19._8_4_ * auVar6._8_4_;
      auVar34._12_4_ = auVar19._12_4_ * auVar6._12_4_;
      auVar19 = vcvtps2dq_avx(auVar34);
      uVar13 = vextractps_avx(auVar19,1);
      auVar19 = vshufps_avx(auVar19,auVar19,0xe8);
      auVar35 = vpslld_avx(auVar19,0x10);
      auVar19 = vpor_avx(auVar35,auVar19);
      auVar19 = vpand_avx(auVar19,auVar26);
      auVar19 = vpmulld_avx(auVar19,auVar27);
      auVar19 = vpand_avx(auVar19,auVar30);
      auVar19 = vpmulld_avx(auVar19,auVar31);
      auVar19 = vpand_avx(auVar19,auVar32);
      auVar19 = vpmulld_avx(auVar19,auVar23);
      auVar19 = vpand_avx(auVar19,ZEXT816(0x2492492409249249));
      this->morton[uVar17].field_0.field_0.code =
           auVar19._4_4_ |
           auVar19._0_4_ |
           ((((uVar13 << 0x10 | uVar13) & 0x30000ff) * 0x101 & 0x300f00f) * 0x11 & 0x30c30c3) * 10 &
           0x12492492;
      uVar15 = (ulong)current->_end;
    }
    std::__sort<embree::avx::BVHBuilderMorton::BuildPrim*,__gnu_cxx::__ops::_Iter_less_iter>
              (this->morton + current->_begin,this->morton + uVar15);
    return;
  }
  mapping.base.field_0.i[2] = 0x7f800000;
  mapping.base.field_0._0_8_ = 0x7f8000007f800000;
  mapping.base.field_0.i[3] = 0x7f800000;
  mapping.scale.field_0.i[2] = 0xff800000;
  mapping.scale.field_0._0_8_ = 0xff800000ff800000;
  mapping.scale.field_0.i[3] = 0xff800000;
  tbb::detail::d1::task_group_context::task_group_context(&context,(context_traits)0x4,CUSTOM_CTX);
  local_108.my_begin = uVar13;
  local_108.my_end = uVar1;
  local_108.my_grainsize = 0x400;
  tbb::detail::d1::
  parallel_reduce<tbb::detail::d1::blocked_range<unsigned_int>,embree::BBox<embree::Vec3fa>,embree::parallel_reduce<unsigned_int,embree::BBox<embree::Vec3fa>,embree::avx::BVHBuilderMorton::BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<8>>,embree::FastAllocator::CachedAllocator,embree::BVHN<8>::CreateAlloc,embree::AABBNode_t<embree::NodeRefPtr<8>,8>::Create,embree::avx::SetBVHNBounds<8>,embree::avx::CreateMortonLeaf<8,embree::TriangleMi<4>>,embree::avx::CalculateMeshBounds<embree::TriangleMesh>,embree::Scene::BuildProgressMonitorInterface>::recreateMortonCodes(embree::range<unsigned_int>const&)const::_lambda(embree::range<unsigned_int>const&)_1_,embree::BBox<embree::Vec3fa>const(embree::BBox<embree::Vec3fa>const&,embree::BBox<embree::Vec3fa>const&)>(unsigned_int,unsigned_int,unsigned_int,embree::BBox<embree::Vec3fa>const&,embree::avx::BVHBuilderMorton::BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<8>>,embree::FastAllocator::CachedAllocator,embree::BVHN<8>::CreateAlloc,embree::AABBNode_t<embree::NodeRefPtr<8>,8>::Create,embree::avx::SetBVHNBounds<8>,embree::avx::CreateMortonLeaf<8,embree::TriangleMi<4>>,embree::avx::CalculateMeshBounds<embree::TriangleMesh>,embree::Scene::BuildProgressMonitorInterface>::recreateMortonCodes(embree::range<unsigned_int>const&)const::_lambda(embree::range<unsigned_int>const&)_1_const&,embree::BBox<embree::Vec3fa>const(const&)(embree::BBox<embree::Vec3fa>const&,embree::BBox<embree::Vec3fa>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_int>const&,embree::BBox<embree::Vec3fa>const&)_1_,embree::BBox<embree::Vec3fa>const(embree::BBox<embree::Vec3fa>const&,embree::BBox<embree::Vec3fa>const&)>
            (&centBounds,(d1 *)&local_108,(blocked_range<unsigned_int> *)&mapping,
             (BBox<embree::Vec3fa> *)&stack0xfffffffffffffec8,
             (anon_class_16_2_ed117de8_conflict24 *)BBox<embree::Vec3fa>::merge,
             (_func_BBox<embree::Vec3fa>_BBox<embree::Vec3fa>_ptr_BBox<embree::Vec3fa>_ptr *)
             &context,(task_group_context *)BBox<embree::Vec3fa>::merge);
  cVar11 = tbb::detail::r1::is_group_execution_cancelled(&context);
  if (cVar11 == '\0') {
    tbb::detail::d1::task_group_context::~task_group_context(&context);
    mapping.base.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)centBounds.lower.field_0;
    auVar19 = vsubps_avx((undefined1  [16])centBounds.upper.field_0,
                         (undefined1  [16])centBounds.lower.field_0);
    auVar23._8_4_ = 0x1fec1e4a;
    auVar23._0_8_ = 0x1fec1e4a1fec1e4a;
    auVar23._12_4_ = 0x1fec1e4a;
    auVar6 = vcmpps_avx(auVar19,auVar23,6);
    auVar23 = vrcpps_avx(auVar19);
    fVar7 = auVar23._0_4_;
    auVar35._0_4_ = auVar19._0_4_ * fVar7;
    fVar8 = auVar23._4_4_;
    auVar35._4_4_ = auVar19._4_4_ * fVar8;
    fVar9 = auVar23._8_4_;
    auVar35._8_4_ = auVar19._8_4_ * fVar9;
    fVar10 = auVar23._12_4_;
    auVar35._12_4_ = auVar19._12_4_ * fVar10;
    auVar28._8_4_ = 0x3f800000;
    auVar28._0_8_ = 0x3f8000003f800000;
    auVar28._12_4_ = 0x3f800000;
    auVar23 = vsubps_avx(auVar28,auVar35);
    auVar19._0_4_ = (fVar7 + fVar7 * auVar23._0_4_) * 1013.76;
    auVar19._4_4_ = (fVar8 + fVar8 * auVar23._4_4_) * 1013.76;
    auVar19._8_4_ = (fVar9 + fVar9 * auVar23._8_4_) * 1013.76;
    auVar19._12_4_ = (fVar10 + fVar10 * auVar23._12_4_) * 1013.76;
    mapping.scale.field_0 =
         (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vandps_avx(auVar6,auVar19);
    tbb::detail::d1::task_group_context::task_group_context(&context,(context_traits)0x4,CUSTOM_CTX)
    ;
    auVar6._8_8_ = 0;
    auVar6._0_4_ = current->_begin;
    auVar6._4_4_ = current->_end;
    auVar6 = vpermilps_avx(auVar6,0xe1);
    local_108._0_8_ = vmovlps_avx(auVar6);
    local_108.my_grainsize = 0x400;
    local_110.func = (anon_class_16_2_00173b7b *)&stack0xfffffffffffffec8;
    tbb::detail::d1::
    parallel_for<tbb::detail::d1::blocked_range<unsigned_int>,embree::parallel_for<unsigned_int,embree::avx::BVHBuilderMorton::BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<8>>,embree::FastAllocator::CachedAllocator,embree::BVHN<8>::CreateAlloc,embree::AABBNode_t<embree::NodeRefPtr<8>,8>::Create,embree::avx::SetBVHNBounds<8>,embree::avx::CreateMortonLeaf<8,embree::TriangleMi<4>>,embree::avx::CalculateMeshBounds<embree::TriangleMesh>,embree::Scene::BuildProgressMonitorInterface>::recreateMortonCodes(embree::range<unsigned_int>const&)const::_lambda(embree::range<unsigned_int>const&)_2_>(unsigned_int,unsigned_int,unsigned_int,embree::avx::BVHBuilderMorton::BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<8>>,embree::FastAllocator::CachedAllocator,embree::BVHN<8>::CreateAlloc,embree::AABBNode_t<embree::NodeRefPtr<8>,8>::Create,embree::avx::SetBVHNBounds<8>,embree::avx::CreateMortonLeaf<8,embree::TriangleMi<4>>,embree::avx::CalculateMeshBounds<embree::TriangleMesh>,embree::Scene::BuildProgressMonitorInterface>::recreateMortonCodes(embree::range<unsigned_int>const&)const::_lambda(embree::range<unsigned_int>const&)_2_const&)::_lambda(tbb::detail::d1::blocked_range<unsigned_int>const&)_1_>
              (&local_108,&local_110,&context);
    cVar11 = tbb::detail::r1::is_group_execution_cancelled(&context);
    if (cVar11 == '\0') {
      tbb::detail::d1::task_group_context::~task_group_context(&context);
      tbb::detail::d1::parallel_sort<embree::avx::BVHBuilderMorton::BuildPrim*>
                (this->morton + current->_begin,this->morton + current->_end);
      return;
    }
    prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar12,"task cancelled");
    __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar12,"task cancelled");
  __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

__noinline void recreateMortonCodes(const range<unsigned>& current) const
        {
          /* fast path for small ranges */
          if (likely(current.size() < 1024))
          {
            /*! recalculate centroid bounds */
            BBox3fa centBounds(empty);
            for (size_t i=current.begin(); i<current.end(); i++)
              centBounds.extend(center2(calculateBounds(morton[i])));

            /* recalculate morton codes */
            MortonCodeMapping mapping(centBounds);
            for (size_t i=current.begin(); i<current.end(); i++)
              morton[i].code = mapping.code(calculateBounds(morton[i]));

            /* sort morton codes */
            std::sort(morton+current.begin(),morton+current.end());
          }
          else
          {
            /*! recalculate centroid bounds */
            auto calculateCentBounds = [&] ( const range<unsigned>& r ) {
              BBox3fa centBounds = empty;
              for (size_t i=r.begin(); i<r.end(); i++)
                centBounds.extend(center2(calculateBounds(morton[i])));
              return centBounds;
            };
            const BBox3fa centBounds = parallel_reduce(current.begin(), current.end(), unsigned(1024),
                                                       BBox3fa(empty), calculateCentBounds, BBox3fa::merge);

            /* recalculate morton codes */
            MortonCodeMapping mapping(centBounds);
            parallel_for(current.begin(), current.end(), unsigned(1024), [&] ( const range<unsigned>& r ) {
                for (size_t i=r.begin(); i<r.end(); i++) {
                  morton[i].code = mapping.code(calculateBounds(morton[i]));
                }
              });

            /*! sort morton codes */
#if defined(TASKING_TBB)
            tbb::parallel_sort(morton+current.begin(),morton+current.end());
#else
            radixsort32(morton+current.begin(),current.size());
#endif
          }
        }